

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O1

void ifft3d(float *data,long M3,long M2,long M)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long oRsiz;
  ulong iRsiz;
  xdouble *indata;
  long lVar4;
  long lVar5;
  long local_68;
  
  if (M < 1 || (M2 < 1 || M3 < 1)) {
    lVar1 = M;
    lVar3 = M2;
    if (((M3 == 0) || (lVar3 = M3, M2 == 0)) || (lVar1 = M2, M == 0)) {
      ifft2d(data,lVar3,lVar1);
      return;
    }
  }
  else {
    lVar3 = 1L << (M & 0x3fU);
    oRsiz = 1L << (M2 & 0x3fU);
    lVar1 = 1L << (M3 & 0x3fU);
    iffts(data,M,lVar1 << (M2 & 0x3fU));
    if (M < 3) {
      if (M3 != 0x3f) {
        lVar5 = 1;
        if (1 < lVar1) {
          lVar5 = lVar1;
        }
        lVar4 = 0;
        do {
          dxpose((xdouble *)(data + (lVar4 << (M + M2 & 0x3fU))),lVar3,(xdouble *)Array2d[M2],oRsiz,
                 oRsiz,lVar3);
          iffts(Array2d[M2],M2,lVar3);
          dxpose((xdouble *)Array2d[M2],oRsiz,(xdouble *)(data + (lVar4 << (M + M2 & 0x3fU))),lVar3,
                 lVar3,oRsiz);
          lVar4 = lVar4 + 2;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
    }
    else if (M3 != 0x3f) {
      lVar5 = 1;
      if (1 < lVar1) {
        lVar5 = lVar1;
      }
      local_68 = 0;
      do {
        if (M != 0x3f) {
          indata = (xdouble *)(data + (local_68 * 2 << (M + M2 & 0x3fU)));
          lVar4 = 0;
          do {
            dxpose(indata,lVar3,(xdouble *)Array2d[M2],oRsiz,oRsiz,4);
            iffts(Array2d[M2],M2,4);
            dxpose((xdouble *)Array2d[M2],oRsiz,indata,lVar3,4,oRsiz);
            lVar4 = lVar4 + 4;
            indata = indata + 4;
          } while (lVar4 < lVar3);
        }
        local_68 = local_68 + 1;
      } while (local_68 != lVar5);
    }
    if (M + M2 < 3) {
      dxpose((xdouble *)data,4,(xdouble *)Array2d[M3],lVar1,lVar1,4);
      iffts(Array2d[M3],M3,4);
      dxpose((xdouble *)Array2d[M3],lVar1,(xdouble *)data,4,4,lVar1);
      return;
    }
    iRsiz = 1L << (M + M2 & 0x3fU);
    uVar2 = 0;
    do {
      dxpose((xdouble *)data,iRsiz,(xdouble *)Array2d[M3],lVar1,lVar1,4);
      iffts(Array2d[M3],M3,4);
      dxpose((xdouble *)Array2d[M3],lVar1,(xdouble *)data,iRsiz,4,lVar1);
      uVar2 = uVar2 + 4;
      data = (float *)((long)data + 0x20);
    } while (uVar2 < iRsiz);
  }
  return;
}

Assistant:

void ifft3d(float *data, long M3, long M2, long M){
/* Compute 2D complex ifft and return results in-place	*/
/* INPUTS */
/* *data = input data array	*/
/* M3 = log2 of fft size number of pages */
/* M2 = log2 of fft size number of rows */
/* M = log2 of fft size number of columns */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
long i2;
const long N = POW2(M);
const long N2 = POW2(M2);
const long N3 = POW2(M3);
if((M3>0)&&(M2>0)&&(M>0)){
	iffts(data, M, N3*N2);
	if (M>2)
		for (i2=0; i2<N3; i2++){
			for (i1=0; i1<N; i1+=4){
				cxpose(data + i2*2*POW2(M2+M) + i1*2, N, Array2d[M2], N2, N2, 4);
				iffts(Array2d[M2], M2, 4);
				cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M) + i1*2, N, 4, N2);
			}
		}
	else{
		for (i2=0; i2<N3; i2++){
			cxpose(data + i2*2*POW2(M2+M), N, Array2d[M2], N2, N2, N);
			iffts(Array2d[M2], M2, N);
			cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M), N, N, N2);
		}
	}
	if ((M2+M)>2)
		for (i1=0; i1<POW2(M2+M); i1+=4){
			cxpose(data + i1*2, POW2(M2+M), Array2d[M3], N3, N3, 4);
			iffts(Array2d[M3], M3, 4);
			cxpose(Array2d[M3], N3, data + i1*2, POW2(M2+M), 4, N3);
		}
	else{
		cxpose(data, POW2(M2+M), Array2d[M3], N3, N3, POW2(M2+M));
		iffts(Array2d[M3], M3, POW2(M2+M));
		cxpose(Array2d[M3], N3, data, POW2(M2+M), POW2(M2+M), N3);
	}
}
else
	if(M3==0) ifft2d(data, M2, M);
	else
		if(M2==0) ifft2d(data, M3, M);
		else
			if(M==0) ifft2d(data, M3, M2);
}